

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  uint64_t *puVar1;
  vec<Minisat::Lit,_int> *out_clause;
  byte bVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  vec<unsigned_int,_int> *pvVar6;
  int v_00;
  Size SVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *this_00;
  vec<unsigned_int,_int> *this_01;
  ulong uVar12;
  long lVar13;
  int j;
  long lVar14;
  ulong uVar15;
  vec<Minisat::Solver::Watcher,_int> *pvVar16;
  int clause_size;
  int local_94;
  int local_90;
  uint local_8c;
  vec<unsigned_int,_int> local_88;
  vec<unsigned_int,_int> local_78;
  long local_60;
  ulong local_58;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_50;
  long local_48;
  uint *local_40;
  uint *local_38;
  
  local_94 = v;
  if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
  goto LAB_00112100;
  if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e7,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v) {
    pcVar10 = 
    "const V &Minisat::IntMap<int, char>::operator[](K) const [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
LAB_00112189:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                  ,0x27,pcVar10);
  }
  if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0')
  {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e8,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  if ((this->super_Solver).assigns.super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
      map.sz <= v) {
    pcVar10 = 
    "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
    goto LAB_00112189;
  }
  bVar2 = (this->super_Solver).assigns.
          super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[v].value;
  if ((bVar2 != l_Undef || (l_Undef & 2) != 0) && (l_Undef & 2 & bVar2) == 0) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e9,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  this_00 = &this->occurs;
  pvVar6 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
           ::lookup(this_00,&local_94);
  local_78.data = (uint *)0x0;
  local_78.sz = 0;
  local_78.cap = 0;
  local_88.data = (uint *)0x0;
  local_88.sz = 0;
  local_88.cap = 0;
  if (pvVar6->sz < 1) {
    local_90 = 0;
    v_00 = local_94;
  }
  else {
    lVar14 = 0;
    do {
      uVar8 = pvVar6->data[lVar14];
      if ((this->super_Solver).ca.ra.sz <= uVar8) goto LAB_001120e1;
      puVar3 = (this->super_Solver).ca.ra.memory;
      this_01 = &local_88;
      if ((0x1f < puVar3[uVar8]) && (this_01 = &local_78, puVar3[(ulong)uVar8 + 1] != local_94 * 2))
      {
        uVar9 = (ulong)(puVar3[uVar8] >> 5);
        uVar15 = 1;
        do {
          uVar12 = uVar15;
          if (uVar9 == uVar12) break;
          uVar15 = uVar12 + 1;
        } while (puVar3[(ulong)uVar8 + uVar12 + 1] != local_94 * 2);
        this_01 = &local_88;
        if (uVar12 < uVar9) {
          this_01 = &local_78;
        }
      }
      vec<unsigned_int,_int>::push(this_01,pvVar6->data + lVar14);
      v_00 = local_94;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pvVar6->sz);
    local_48 = (long)local_78.sz;
    local_90 = 0;
    if (0 < local_48) {
      local_58 = local_88._8_8_ & 0xffffffff;
      local_38 = local_78.data;
      local_40 = local_88.data;
      local_60 = 0;
      iVar11 = 0;
      local_50 = this_00;
      do {
        if (0 < (int)local_58) {
          uVar15 = 0;
          do {
            uVar8 = (this->super_Solver).ca.ra.sz;
            if ((uVar8 <= local_38[local_60]) || (uVar8 <= local_40[uVar15])) goto LAB_001120e1;
            puVar3 = (this->super_Solver).ca.ra.memory;
            bVar4 = merge(this,(Clause *)(puVar3 + local_38[local_60]),
                          (Clause *)(puVar3 + local_40[uVar15]),v_00,&local_90);
            if (bVar4) {
              bVar4 = true;
              if (*(int *)&(this->super_Solver).field_0x35c + pvVar6->sz <= iVar11)
              goto LAB_001120a1;
              iVar11 = iVar11 + 1;
              if ((this->clause_lim != -1) && (this->clause_lim < local_90)) goto LAB_001120a1;
            }
            uVar15 = uVar15 + 1;
          } while (local_58 != uVar15);
        }
        local_60 = local_60 + 1;
        this_00 = local_50;
      } while (local_60 != local_48);
    }
  }
  if (v_00 < (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz) {
    (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v_00] =
         '\x01';
    lVar14 = (long)local_94;
    if (local_94 <
        (this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz)
    {
      pcVar10 = (this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                .map.data;
      if (pcVar10[lVar14] != '\0') {
        puVar1 = &(this->super_Solver).dec_vars;
        *puVar1 = *puVar1 - 1;
      }
      pcVar10[lVar14] = '\0';
      if (((this->super_Solver).order_heap.indices.map.sz <= local_94) ||
         ((this->super_Solver).order_heap.indices.map.data[lVar14] < 0)) {
        if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map
            .sz <= local_94) goto LAB_00112100;
        if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map
            .data[lVar14] != '\0') {
          Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                    (&(this->super_Solver).order_heap,local_94);
        }
      }
      this->eliminated_vars = this->eliminated_vars + 1;
      if (local_88.sz < local_78.sz) {
        if (0 < local_88.sz) {
          lVar14 = 0;
          do {
            if ((this->super_Solver).ca.ra.sz <= local_88.data[lVar14]) {
LAB_001120e1:
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            mkElimClause(&this->elimclauses,local_94,
                         (Clause *)((this->super_Solver).ca.ra.memory + local_88.data[lVar14]));
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_88.sz);
        }
        local_8c = local_94 * 2;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_8c);
        local_8c = 1;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_8c);
      }
      else {
        if (0 < local_78.sz) {
          lVar14 = 0;
          do {
            if ((this->super_Solver).ca.ra.sz <= local_78.data[lVar14]) goto LAB_001120e1;
            mkElimClause(&this->elimclauses,local_94,
                         (Clause *)((this->super_Solver).ca.ra.memory + local_78.data[lVar14]));
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_78.sz);
        }
        local_8c = local_94 * 2 + 1;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_8c);
        local_8c = 1;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_8c);
      }
      if (0 < pvVar6->sz) {
        lVar14 = 0;
        do {
          removeClause(this,pvVar6->data[lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar14 < pvVar6->sz);
      }
      if (0 < local_78.sz) {
        out_clause = &(this->super_Solver).add_tmp;
        uVar15 = local_88._8_8_ & 0xffffffff;
        lVar14 = 0;
        SVar7 = local_78.sz;
        do {
          if (0 < (int)uVar15) {
            lVar13 = 0;
            do {
              uVar8 = (this->super_Solver).ca.ra.sz;
              if ((uVar8 <= local_78.data[lVar14]) || (uVar8 <= local_88.data[lVar13]))
              goto LAB_001120e1;
              puVar3 = (this->super_Solver).ca.ra.memory;
              bVar4 = merge(this,(Clause *)(puVar3 + local_78.data[lVar14]),
                            (Clause *)(puVar3 + local_88.data[lVar13]),local_94,out_clause);
              if ((bVar4) && (bVar4 = addClause_(this,out_clause), !bVar4)) {
                bVar4 = false;
                goto LAB_001120a1;
              }
              lVar13 = lVar13 + 1;
              uVar15 = (ulong)local_88.sz;
            } while (lVar13 < (long)uVar15);
            SVar7 = local_78.sz;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < SVar7);
      }
      if (local_94 < (this->occurs).occs.map.sz) {
        pvVar6 = (this_00->occs).map.data;
        puVar3 = pvVar6[local_94].data;
        if (puVar3 != (uint *)0x0) {
          pvVar6 = pvVar6 + local_94;
          pvVar6->sz = 0;
          free(puVar3);
          pvVar6->data = (uint *)0x0;
          pvVar6->cap = 0;
        }
        uVar5 = local_94 * 2;
        uVar8 = (this->super_Solver).watches.occs.map.sz;
        if (uVar8 != uVar5 && SBORROW4(uVar8,uVar5) == (int)(uVar8 + local_94 * -2) < 0) {
          pvVar16 = (this->super_Solver).watches.occs.map.data;
          if (pvVar16[(int)uVar5].sz == 0) {
            pvVar16 = pvVar16 + (int)uVar5;
            if (pvVar16->data != (Watcher *)0x0) {
              pvVar16->sz = 0;
              free(pvVar16->data);
              pvVar16->data = (Watcher *)0x0;
              pvVar16->cap = 0;
              uVar8 = (this->super_Solver).watches.occs.map.sz;
              uVar5 = local_94 * 2;
            }
          }
          uVar5 = uVar5 | 1;
          if ((int)uVar5 < (int)uVar8) {
            pvVar16 = (this->super_Solver).watches.occs.map.data;
            if (pvVar16[(int)uVar5].sz == 0) {
              pvVar16 = pvVar16 + (int)uVar5;
              if (pvVar16->data != (Watcher *)0x0) {
                pvVar16->sz = 0;
                free(pvVar16->data);
                pvVar16->data = (Watcher *)0x0;
                pvVar16->cap = 0;
              }
            }
            bVar4 = backwardSubsumptionCheck(this,false);
LAB_001120a1:
            if (local_88.data != (uint *)0x0) {
              local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
              free(local_88.data);
            }
            if (local_78.data != (uint *)0x0) {
              local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
              free(local_78.data);
            }
            return bVar4;
          }
        }
        pcVar10 = 
        "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
        ;
      }
      else {
        pcVar10 = 
        "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
      }
      goto LAB_00112115;
    }
  }
LAB_00112100:
  pcVar10 = 
  "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
  ;
LAB_00112115:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,pcVar10);
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]); 

    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    // Free occurs list for this variable:
    occurs[v].clear(true);
    
    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}